

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponential_biased.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::profiling_internal::ExponentialBiased::Initialize(ExponentialBiased *this)

{
  int local_34;
  uint64_t uStack_30;
  int i;
  uint64_t r;
  ExponentialBiased *this_local;
  
  LOCK();
  UNLOCK();
  uStack_30 = (long)&this->rng_ +
              (ulong)(uint)Initialize::global_rand.super___atomic_base<unsigned_int>._M_i;
  Initialize::global_rand.super___atomic_base<unsigned_int>._M_i =
       (__atomic_base<unsigned_int>)
       (__atomic_base<unsigned_int>)
       (Initialize::global_rand.super___atomic_base<unsigned_int>._M_i + 1)._M_i;
  for (local_34 = 0; local_34 < 0x14; local_34 = local_34 + 1) {
    uStack_30 = NextRandom(uStack_30);
  }
  this->rng_ = uStack_30;
  this->initialized_ = true;
  return;
}

Assistant:

void ExponentialBiased::Initialize() {
  // We don't get well distributed numbers from `this` so we call NextRandom() a
  // bunch to mush the bits around. We use a global_rand to handle the case
  // where the same thread (by memory address) gets created and destroyed
  // repeatedly.
  ABSL_CONST_INIT static std::atomic<uint32_t> global_rand(0);
  uint64_t r = reinterpret_cast<uint64_t>(this) +
               global_rand.fetch_add(1, std::memory_order_relaxed);
  for (int i = 0; i < 20; ++i) {
    r = NextRandom(r);
  }
  rng_ = r;
  initialized_ = true;
}